

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O2

base_learner * mwt_setup(options_i *options,vw *all)

{
  undefined8 uVar1;
  int iVar2;
  size_t i;
  option_group_definition *poVar3;
  ulong uVar4;
  base_learner *pbVar5;
  learner<char,_example> *base;
  learner<MWT::mwt,_example> *plVar6;
  long lVar7;
  code *predict;
  code *learn;
  undefined **ppuVar8;
  label_parser *plVar9;
  byte bVar10;
  bool exclude_eval;
  allocator local_436;
  allocator local_435;
  allocator local_434;
  allocator local_433;
  allocator local_432;
  allocator local_431;
  free_ptr<MWT::mwt> c;
  string s;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0;
  string local_3a0 [32];
  string local_380;
  string local_360;
  string local_340;
  option_group_definition new_options;
  undefined1 local_2e8 [160];
  undefined1 local_248 [160];
  stringstream ss;
  undefined1 local_198 [32];
  string local_178 [64];
  bool local_138;
  
  bVar10 = 0;
  scoped_calloc_or_throw<MWT::mwt>();
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  exclude_eval = false;
  std::__cxx11::string::string((string *)&local_340,"Multiworld Testing Options",(allocator *)&ss);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::string((string *)&local_360,"multiworld_test",&local_431);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&ss,&local_360,&s);
  local_138 = true;
  std::__cxx11::string::string(local_400,"Evaluate features as a policies",&local_432);
  std::__cxx11::string::_M_assign(local_178);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&new_options,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&ss);
  std::__cxx11::string::string((string *)&local_380,"learn",&local_433);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2e8,&local_380,
             &(c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_MWT::mwt_*,_false>._M_head_impl)->num_classes);
  std::__cxx11::string::string(local_3a0,"Do Contextual Bandit learning on <n> classes.",&local_434)
  ;
  std::__cxx11::string::_M_assign((string *)(local_2e8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar3,(typed_option<unsigned_int> *)local_2e8);
  std::__cxx11::string::string((string *)&local_3c0,"exclude_eval",&local_435);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_248,&local_3c0,&exclude_eval);
  std::__cxx11::string::string(local_3e0,"Discard mwt policy features before learning",&local_436);
  std::__cxx11::string::_M_assign((string *)(local_248 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_248);
  std::__cxx11::string::~string(local_3e0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_248);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string(local_3a0);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_2e8);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string(local_400);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&ss);
  std::__cxx11::string::~string((string *)&local_360);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&ss,"multiworld_test",(allocator *)local_2e8);
  iVar2 = (*options->_vptr_options_i[1])(options,&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((char)iVar2 == '\0') {
    plVar6 = (learner<MWT::mwt,_example> *)0x0;
  }
  else {
    for (uVar4 = 0; uVar4 < s._M_string_length; uVar4 = uVar4 + 1) {
      (c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.super__Head_base<0UL,_MWT::mwt_*,_false>
      ._M_head_impl)->namespaces[(byte)s._M_dataplus._M_p[uVar4]] = true;
    }
    (c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.super__Head_base<0UL,_MWT::mwt_*,_false>.
    _M_head_impl)->all = all;
    calloc_reserve<MWT::policy_data>
              (&(c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_MWT::mwt_*,_false>._M_head_impl)->evals,
               1L << ((byte)all->num_bits & 0x3f));
    ((c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.super__Head_base<0UL,_MWT::mwt_*,_false>.
     _M_head_impl)->evals)._end =
         ((c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_MWT::mwt_*,_false>._M_head_impl)->evals)._begin +
         (1L << ((byte)all->num_bits & 0x3f));
    all->delete_prediction = delete_scalars;
    ppuVar8 = &CB::cb_label;
    plVar9 = &all->p->lp;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      plVar9->default_label = (_func_void_void_ptr *)*ppuVar8;
      ppuVar8 = ppuVar8 + (ulong)bVar10 * -2 + 1;
      plVar9 = (label_parser *)((long)plVar9 + (ulong)bVar10 * -0x10 + 8);
    }
    all->label_type = cb;
    if ((c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_MWT::mwt_*,_false>._M_head_impl)->num_classes != 0) {
      (c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.super__Head_base<0UL,_MWT::mwt_*,_false>
      ._M_head_impl)->learn = true;
      std::__cxx11::string::string((string *)&ss,"cb",(allocator *)local_2e8);
      iVar2 = (*options->_vptr_options_i[1])(options,&ss);
      std::__cxx11::string::~string((string *)&ss);
      if ((char)iVar2 == '\0') {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::_M_insert<unsigned_long>((ulong)local_198);
        std::__cxx11::string::string((string *)local_2e8,"cb",(allocator *)local_400);
        std::__cxx11::stringbuf::str();
        (*options->_vptr_options_i[5])(options,local_2e8,local_248);
        std::__cxx11::string::~string((string *)local_248);
        std::__cxx11::string::~string((string *)local_2e8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
    }
    if ((c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_MWT::mwt_*,_false>._M_head_impl)->learn == true) {
      if (exclude_eval == true) {
        pbVar5 = setup_base(options,all);
        base = LEARNER::as_singleline<char,char>(pbVar5);
        predict = MWT::predict_or_learn<true,true,false>;
        learn = MWT::predict_or_learn<true,true,true>;
      }
      else {
        pbVar5 = setup_base(options,all);
        base = LEARNER::as_singleline<char,char>(pbVar5);
        predict = MWT::predict_or_learn<true,false,false>;
        learn = MWT::predict_or_learn<true,false,true>;
      }
    }
    else {
      pbVar5 = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(pbVar5);
      predict = MWT::predict_or_learn<false,false,false>;
      learn = MWT::predict_or_learn<false,false,true>;
    }
    plVar6 = LEARNER::learner<MWT::mwt,example>::init_learner<LEARNER::learner<char,example>>
                       (c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_MWT::mwt_*,_false>._M_head_impl,base,learn,predict,1,
                        scalars);
    c._M_t.super___uniq_ptr_impl<MWT::mwt,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_MWT::mwt_*,_void_(*)(void_*)>.super__Head_base<0UL,_MWT::mwt_*,_false>.
    _M_head_impl = (mwt *)0x0;
    *(code **)(plVar6 + 0x80) = MWT::save_load;
    uVar1 = *(undefined8 *)(plVar6 + 0x18);
    *(undefined8 *)(plVar6 + 0x70) = uVar1;
    *(undefined8 *)(plVar6 + 0x78) = *(undefined8 *)(plVar6 + 0x20);
    *(undefined8 *)(plVar6 + 0x58) = uVar1;
    *(code **)(plVar6 + 0x68) = MWT::finish_example;
    *(undefined8 *)(plVar6 + 0xb8) = uVar1;
    *(undefined8 *)(plVar6 + 0xc0) = *(undefined8 *)(plVar6 + 0x20);
    *(code **)(plVar6 + 200) = MWT::finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&s);
  std::unique_ptr<MWT::mwt,_void_(*)(void_*)>::~unique_ptr(&c);
  return (base_learner *)plVar6;
}

Assistant:

base_learner* mwt_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<mwt>();
  string s;
  bool exclude_eval = false;
  option_group_definition new_options("Multiworld Testing Options");
  new_options.add(make_option("multiworld_test", s).keep().help("Evaluate features as a policies"))
      .add(make_option("learn", c->num_classes).help("Do Contextual Bandit learning on <n> classes."))
      .add(make_option("exclude_eval", exclude_eval).help("Discard mwt policy features before learning"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multiworld_test"))
    return nullptr;

  for (size_t i = 0; i < s.size(); i++) c->namespaces[(unsigned char)s[i]] = true;
  c->all = &all;

  calloc_reserve(c->evals, all.length());
  c->evals.end() = c->evals.begin() + all.length();

  all.delete_prediction = delete_scalars;
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  if (c->num_classes > 0)
  {
    c->learn = true;

    if (!options.was_supplied("cb"))
    {
      stringstream ss;
      ss << c->num_classes;
      options.insert("cb", ss.str());
    }
  }

  learner<mwt, example>* l;
  if (c->learn)
    if (exclude_eval)
      l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<true, true, true>,
          predict_or_learn<true, true, false>, 1, prediction_type::scalars);
    else
      l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<true, false, true>,
          predict_or_learn<true, false, false>, 1, prediction_type::scalars);
  else
    l = &init_learner(c, as_singleline(setup_base(options, all)), predict_or_learn<false, false, true>,
        predict_or_learn<false, false, false>, 1, prediction_type::scalars);

  l->set_save_load(save_load);
  l->set_finish_example(finish_example);
  l->set_finish(finish);
  return make_base(*l);
}